

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::write_pointer<unsigned_long>
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,unsigned_long value,
          format_specs *specs)

{
  wchar_t *pwVar1;
  buffer<wchar_t> *pbVar2;
  size_t sVar3;
  unsigned_long uVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  pointer_writer<unsigned_long> pw;
  format_specs specs_copy;
  pointer_writer<unsigned_long> local_68;
  format_specs local_58;
  
  lVar5 = 4;
  uVar4 = value;
  lVar8 = 2;
  do {
    lVar7 = lVar8;
    lVar5 = lVar5 + 4;
    lVar8 = lVar7 + 1;
    bVar10 = 0xf < uVar4;
    uVar4 = uVar4 >> 4;
  } while (bVar10);
  local_68.num_digits = (int)lVar7 + -1;
  local_68.value = value;
  if (specs == (format_specs *)0x0) {
    pbVar2 = (this->out_).container;
    sVar3 = pbVar2->size_;
    uVar9 = lVar8 + sVar3;
    if (pbVar2->capacity_ < uVar9) {
      (**pbVar2->_vptr_buffer)(pbVar2,uVar9);
    }
    pbVar2->size_ = uVar9;
    pwVar1 = pbVar2->ptr_ + sVar3;
    pwVar1[0] = L'0';
    pwVar1[1] = L'x';
    piVar6 = (int *)(lVar5 + (long)pwVar1);
    do {
      *piVar6 = (int)"0123456789abcdef"[(uint)value & 0xf];
      piVar6 = piVar6 + -1;
      bVar10 = 0xf < value;
      value = value >> 4;
    } while (bVar10);
  }
  else {
    local_58.width = specs->width;
    local_58.precision = specs->precision;
    local_58.type = specs->type;
    local_58._9_3_ = *(undefined3 *)&specs->field_0x9;
    local_58.fill.data_[0] = (specs->fill).data_[0];
    local_58.fill.data_._4_8_ = *(undefined8 *)((specs->fill).data_ + 1);
    local_58.fill.data_._12_8_ = *(undefined8 *)((specs->fill).data_ + 3);
    local_58.fill.data_[5] = (specs->fill).data_[5];
    if ((local_58._8_8_ & 0xf00) == 0) {
      local_58._8_8_ = local_58._8_8_ | 0x200;
    }
    basic_writer<fmt::v6::buffer_range<wchar_t>>::
    write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::pointer_writer<unsigned_long>&>
              ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this,&local_58,&local_68);
  }
  return;
}

Assistant:

void write_pointer(UIntPtr value, const format_specs* specs) {
    int num_digits = count_digits<4>(value);
    auto pw = pointer_writer<UIntPtr>{value, num_digits};
    if (!specs) return pw(reserve(to_unsigned(num_digits) + 2));
    format_specs specs_copy = *specs;
    if (specs_copy.align == align::none) specs_copy.align = align::right;
    write_padded(specs_copy, pw);
  }